

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDirectoryIterator.cpp
# Opt level: O3

void __thiscall de::DirectoryIterator::DirectoryIterator(DirectoryIterator *this,FilePath *path)

{
  bool bVar1;
  Type TVar2;
  DIR *pDVar3;
  
  FilePath::normalize(&this->m_path,path);
  this->m_handle = (DIR *)0x0;
  this->m_curEntry = (dirent *)0x0;
  bVar1 = FilePath::exists(&this->m_path);
  if (!bVar1) {
    throwRuntimeError((char *)0x0,"m_path.exists()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                      ,0x55);
  }
  TVar2 = FilePath::getType(&this->m_path);
  if (TVar2 != TYPE_DIRECTORY) {
    throwRuntimeError((char *)0x0,"m_path.getType() == FilePath::TYPE_DIRECTORY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                      ,0x56);
  }
  pDVar3 = opendir((this->m_path).m_path._M_dataplus._M_p);
  this->m_handle = (DIR *)pDVar3;
  if (pDVar3 == (DIR *)0x0) {
    throwRuntimeError((char *)0x0,"m_handle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deDirectoryIterator.cpp"
                      ,0x59);
  }
  next(this);
  return;
}

Assistant:

DirectoryIterator::DirectoryIterator (const FilePath& path)
	: m_path	(FilePath::normalize(path))
	, m_handle	(DE_NULL)
	, m_curEntry(DE_NULL)
{
	DE_CHECK_RUNTIME_ERR(m_path.exists());
	DE_CHECK_RUNTIME_ERR(m_path.getType() == FilePath::TYPE_DIRECTORY);

	m_handle = opendir(m_path.getPath());
	DE_CHECK_RUNTIME_ERR(m_handle);

	// Find first entry
	next();
}